

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureMS5611.cpp
# Opt level: O1

void __thiscall RTPressureMS5611::pressureBackground(RTPressureMS5611 *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint64_t uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint8_t data [3];
  byte local_b;
  byte local_a;
  byte local_9;
  
  if (this->m_state == 1) {
    uVar5 = RTMath::currentUSecsSinceEpoch();
    if (9999 < uVar5 - this->m_timer) {
      bVar3 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                this->m_pressureAddr,'\0','\x03',&local_b,
                                "Failed to read MS5611 temperature");
      if (bVar3) {
        uVar6 = (ulong)local_9 | (ulong)((uint)local_a << 8 | (uint)local_b << 0x10);
        this->m_D2 = (uint32_t)uVar6;
        lVar7 = uVar6 + (ulong)this->m_calData[4] * -0x100;
        uVar1 = (uint)((ulong)this->m_calData[5] * lVar7 >> 0x17);
        iVar4 = uVar1 + 2000;
        lVar8 = ((long)((ulong)this->m_calData[3] * lVar7) >> 7) +
                (ulong)this->m_calData[1] * 0x10000;
        lVar9 = ((long)((ulong)this->m_calData[2] * lVar7) >> 8) +
                (ulong)this->m_calData[0] * 0x8000;
        if (0x7ffff82f < uVar1) {
          uVar2 = uVar1 * uVar1 * 5;
          uVar11 = (ulong)(uVar2 >> 1);
          uVar6 = (ulong)(uVar2 >> 2);
          if (iVar4 < -0x5dc) {
            iVar10 = (uVar1 + 0xdac) * (uVar1 + 0xdac);
            uVar11 = uVar11 + (uint)(iVar10 * 7);
            uVar6 = uVar6 + ((uint)(iVar10 * 0xb) >> 1);
          }
          iVar4 = iVar4 - (int)((ulong)(lVar7 * lVar7) >> 0x1f);
          lVar8 = lVar8 - uVar11;
          lVar9 = lVar9 - uVar6;
        }
        this->m_pressure =
             (float)(int)((ulong)(((long)((ulong)this->m_D1 * lVar9) >> 0x15) - lVar8) >> 0xf) /
             100.0;
        this->m_temperature = (float)iVar4 / 100.0;
        this->m_validReadings = true;
        this->m_state = 0;
      }
    }
  }
  else if (this->m_state == 2) {
    uVar5 = RTMath::currentUSecsSinceEpoch();
    if (9999 < uVar5 - this->m_timer) {
      bVar3 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                this->m_pressureAddr,'\0','\x03',&local_b,
                                "Failed to read MS5611 pressure");
      if (bVar3) {
        this->m_D1 = (uint)local_9 | (uint)local_a << 8 | (uint)local_b << 0x10;
        bVar3 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                   this->m_pressureAddr,'X','\0',(uchar *)0x0,
                                   "Failed to start MS5611 temperature conversion");
        if (bVar3) {
          this->m_state = 1;
          uVar5 = RTMath::currentUSecsSinceEpoch();
          this->m_timer = uVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void RTPressureMS5611::pressureBackground()
{
    uint8_t data[3];

    switch (m_state) {
        case MS5611_STATE_IDLE:
        break;

        case MS5611_STATE_PRESSURE:
        if ((RTMath::currentUSecsSinceEpoch() - m_timer) < 10000)
            break;                                          // not time yet
        if (!m_settings->HALRead(m_pressureAddr, MS5611_CMD_ADC, 3, data, "Failed to read MS5611 pressure")) {
            break;
        }
        m_D1 = (((uint32_t)data[0]) << 16) + (((uint32_t)data[1]) << 8) + (uint32_t)data[2];

        // start temperature conversion

        if (!m_settings->HALWrite(m_pressureAddr, MS5611_CMD_CONV_D2, 0, 0, "Failed to start MS5611 temperature conversion")) {
            break;
        } else {
            m_state = MS5611_STATE_TEMPERATURE;
            m_timer = RTMath::currentUSecsSinceEpoch();
        }
        break;

        case MS5611_STATE_TEMPERATURE:
        if ((RTMath::currentUSecsSinceEpoch() - m_timer) < 10000)
            break;                                          // not time yet
        if (!m_settings->HALRead(m_pressureAddr, MS5611_CMD_ADC, 3, data, "Failed to read MS5611 temperature")) {
            break;
        }
        m_D2 = (((uint32_t)data[0]) << 16) + (((uint32_t)data[1]) << 8) + (uint32_t)data[2];

        //  call this function for testing only
        //  should give T = 2007 (20.07C) and pressure 100009 (1000.09hPa)

        // setTestData();

        //  now calculate the real values

        int64_t deltaT = (int32_t)m_D2 - (((int32_t)m_calData[4]) << 8);

        int32_t temperature = 2000 + ((deltaT * (int64_t)m_calData[5]) >> 23); // note - this needs to be divided by 100

        int64_t offset = ((int64_t)m_calData[1] << 16) + (((int64_t)m_calData[3] * deltaT) >> 7);
        int64_t sens = ((int64_t)m_calData[0] << 15) + (((int64_t)m_calData[2] * deltaT) >> 8);

        //  do second order temperature compensation

        if (temperature < 2000) {
            int64_t T2 = (deltaT * deltaT) >> 31;
            int64_t offset2 = 5 * ((temperature - 2000) * (temperature - 2000)) / 2;
            int64_t sens2 = offset2 / 2;
            if (temperature < -1500) {
                offset2 += 7 * (temperature + 1500) * (temperature + 1500);
                sens2 += 11 * ((temperature + 1500) * (temperature + 1500)) / 2;
            }
            temperature -= T2;
            offset -= offset2;
            sens -=sens2;
        }

        m_pressure = (RTFLOAT)(((((int64_t)m_D1 * sens) >> 21) - offset) >> 15) / (RTFLOAT)100.0;
        m_temperature = (RTFLOAT)temperature/(RTFLOAT)100;

        // printf("Temp: %f, pressure: %f\n", m_temperature, m_pressure);

        m_validReadings = true;
        m_state = MS5611_STATE_IDLE;
        break;
    }
}